

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void freeTable(vm *v)

{
  if ((v->m->table_sec).table_segment_count != 0) {
    if ((v->table).itemCount != 0) {
      free((v->table).item);
    }
    (v->table).item = (function_index *)0x0;
    (v->table).itemCount = 0;
  }
  return;
}

Assistant:

void freeTable(vm *v) {
    if (v->m->table_sec.table_segment_count > 0) {
        table *table = &v->table;
        if (table->itemCount > 0 && table->item != NULL)
            free(table->item);
        table->item = NULL;
        table->itemCount = 0;
    }
}